

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O2

void UCNV_TO_U_CALLBACK_ESCAPE_63
               (void *context,UConverterToUnicodeArgs *toArgs,char *codeUnits,int32_t length,
               UConverterCallbackReason reason,UErrorCode *err)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  UChar *buffer;
  int32_t length_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  UChar uniValueString [48];
  
  if ((int)reason < 3) {
    if (context == (void *)0x0) {
      uVar5 = 0;
      uVar6 = (ulong)(uint)length;
      if (length < 1) {
        uVar6 = uVar5;
      }
      length_00 = 0;
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        (uniValueString + length_00)[0] = L'%';
        (uniValueString + length_00)[1] = L'X';
        iVar2 = uprv_itou_63(uniValueString + (long)length_00 + 2,0x2e - length_00,
                             (uint)(byte)codeUnits[uVar5],0x10,2);
        length_00 = length_00 + iVar2 + 2;
      }
    }
    else {
      cVar1 = *context;
      length_00 = 0;
      if (length < 1) {
        length = 0;
      }
      uVar6 = (ulong)(uint)length;
      if (cVar1 == 'X') {
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          (uniValueString + length_00)[0] = L'&';
          (uniValueString + length_00)[1] = L'#';
          uniValueString[(long)length_00 + 2] = L'x';
          iVar2 = uprv_itou_63(uniValueString + (long)length_00 + 3,0x2d - length_00,
                               (uint)(byte)codeUnits[uVar5],0x10,0);
          iVar3 = iVar2 + length_00;
          length_00 = length_00 + iVar2 + 4;
          uniValueString[iVar3 + 3] = L';';
        }
      }
      else if (cVar1 == 'D') {
        length_00 = 0;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          (uniValueString + length_00)[0] = L'&';
          (uniValueString + length_00)[1] = L'#';
          iVar2 = uprv_itou_63(uniValueString + (long)length_00 + 2,0x2e - length_00,
                               (uint)(byte)codeUnits[uVar5],10,0);
          iVar3 = iVar2 + length_00;
          length_00 = length_00 + iVar2 + 3;
          uniValueString[iVar3 + 2] = L';';
        }
      }
      else if (cVar1 == 'C') {
        length_00 = 0;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          (uniValueString + length_00)[0] = L'\\';
          (uniValueString + length_00)[1] = L'x';
          iVar2 = uprv_itou_63(uniValueString + (long)length_00 + 2,0x2e - length_00,
                               (uint)(byte)codeUnits[uVar5],0x10,2);
          length_00 = length_00 + iVar2 + 2;
        }
      }
      else {
        buffer = uniValueString + 2;
        for (lVar4 = 0; uVar6 * 4 + lVar4 != 0; lVar4 = lVar4 + -4) {
          buffer[-2] = L'%';
          buffer[-1] = L'X';
          uprv_itou_63(buffer,(int)lVar4 + 0x2e,(uint)(byte)*codeUnits,0x10,2);
          codeUnits = (char *)((byte *)codeUnits + 1);
          buffer = buffer + 4;
        }
        length_00 = -(int)lVar4;
      }
    }
    *err = U_ZERO_ERROR;
    ucnv_cbToUWriteUChars_63(toArgs,uniValueString,length_00,0,err);
  }
  return;
}

Assistant:

U_CAPI void   U_EXPORT2
UCNV_TO_U_CALLBACK_ESCAPE (
                 const void *context,
                 UConverterToUnicodeArgs *toArgs,
                 const char* codeUnits,
                 int32_t length,
                 UConverterCallbackReason reason,
                 UErrorCode * err)
{
    UChar uniValueString[VALUE_STRING_LENGTH];
    int32_t valueStringLength = 0;
    int32_t i = 0;

    if (reason > UCNV_IRREGULAR)
    {
        return;
    }

    if(context==NULL)
    {    
        while (i < length)
        {
            uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
            uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
            valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
        }
    }
    else
    {
        switch(*((char*)context))
        {
        case UCNV_PRV_ESCAPE_XML_DEC:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 10, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;

        case UCNV_PRV_ESCAPE_XML_HEX:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;
        case UCNV_PRV_ESCAPE_C:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 2);
            }
            break;
        default:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
                uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
                valueStringLength += 2;
            }
        }
    }
    /* reset the error */
    *err = U_ZERO_ERROR;

    ucnv_cbToUWriteUChars(toArgs, uniValueString, valueStringLength, 0, err);
}